

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSThread.h
# Opt level: O0

void ThreadYield(void)

{
  sched_yield();
  return;
}

Assistant:

inline void ThreadYield(void)
{
#ifdef _WIN32
#ifndef WINCE
	SwitchToThread();
#else
	Sleep(0);
#endif // !WINCE
#else 
	// Disabled by default because it is a GNU extension.
#ifdef ENABLE_PTHREAD_YIELD
	pthread_yield();
#else
	sched_yield();
#endif // ENABLE_PTHREAD_YIELD
#endif // _WIN32
}